

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

void al_get_clipping_rectangle(int *x,int *y,int *w,int *h)

{
  ALLEGRO_BITMAP *pAVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  ALLEGRO_BITMAP *bitmap;
  
  pAVar1 = al_get_target_bitmap();
  if (in_RDI != (int *)0x0) {
    *in_RDI = pAVar1->cl;
  }
  if (in_RSI != (int *)0x0) {
    *in_RSI = pAVar1->ct;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = pAVar1->cr_excl - pAVar1->cl;
  }
  if (in_RCX != (int *)0x0) {
    *in_RCX = pAVar1->cb_excl - pAVar1->ct;
  }
  return;
}

Assistant:

void al_get_clipping_rectangle(int *x, int *y, int *w, int *h)
{
   ALLEGRO_BITMAP *bitmap = al_get_target_bitmap();

   ASSERT(bitmap);

   if (x) *x = bitmap->cl;
   if (y) *y = bitmap->ct;
   if (w) *w = bitmap->cr_excl - bitmap->cl;
   if (h) *h = bitmap->cb_excl - bitmap->ct;
}